

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
cfd::core::ToArrayFromString
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          string *string_path,string *caller_name,uint8_t depth)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  char *pcVar6;
  CfdException *pCVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  CfdSourceLocation local_1b0;
  uint local_198;
  undefined1 local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  CfdSourceLocation local_170;
  uint local_154;
  char *pcStack_150;
  uint32_t value;
  char *p_str_end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  CfdSourceLocation local_120;
  undefined4 local_108;
  undefined1 local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  CfdSourceLocation local_e0;
  string local_c8 [39];
  byte local_a1;
  undefined1 local_a0 [7];
  bool hardened;
  string str;
  size_t index;
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  uint8_t depth_local;
  string *caller_name_local;
  string *string_path_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = depth;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_60,"/",&local_61);
  StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40,(string *)string_path,(string *)local_60);
  ::std::__cxx11::string::~string(local_60);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  str.field_2._8_8_ = 0;
  do {
    uVar1 = str.field_2._8_8_;
    sVar3 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
    if (sVar3 <= (ulong)uVar1) {
      bVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        (__return_storage_ptr__);
      if (!bVar2) {
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        local_108 = 1;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40);
        if ((list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    (__return_storage_ptr__);
        }
        return __return_storage_ptr__;
      }
      local_1b0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                   ,0x2f);
      local_1b0.filename = local_1b0.filename + 1;
      local_1b0.line = 0xe1;
      local_1b0.funcname = "ToArrayFromString";
      logger::warn<std::__cxx11::string_const&>
                (&local_1b0,"{} bip32 string path empty.",caller_name);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+(&local_1d0,caller_name," bip32 string path empty.");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_1d0);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pvVar4 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,str.field_2._8_8_);
    ::std::__cxx11::string::string((string *)local_a0,(string *)pvVar4);
    local_a1 = 0;
    uVar5 = ::std::__cxx11::string::size();
    if ((1 < uVar5) &&
       (((pcVar6 = (char *)::std::__cxx11::string::back(), *pcVar6 == '\'' ||
         (pcVar6 = (char *)::std::__cxx11::string::back(), *pcVar6 == 'h')) ||
        (pcVar6 = (char *)::std::__cxx11::string::back(), *pcVar6 == 'H')))) {
      ::std::__cxx11::string::size();
      ::std::__cxx11::string::substr((ulong)local_c8,(ulong)local_a0);
      ::std::__cxx11::string::operator=((string *)local_a0,local_c8);
      ::std::__cxx11::string::~string(local_c8);
      local_a1 = 1;
    }
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"m");
    if ((bVar2) ||
       (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,"M"), bVar2)) {
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ != '\0') {
        local_e0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                     ,0x2f);
        local_e0.filename = local_e0.filename + 1;
        local_e0.line = 0xb8;
        local_e0.funcname = "ToArrayFromString";
        logger::warn<std::__cxx11::string_const&>
                  (&local_e0,"{} bip32 path fail. this key is not master key.",caller_name);
        local_101 = 1;
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+(&local_100,caller_name," bip32 path fail. this key is not master key.");
        CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_100);
        local_101 = 0;
        __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_108 = 4;
    }
    else {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcStack_150 = (char *)0x0;
        uVar5 = ::std::__cxx11::string::size();
        if (((uVar5 < 3) ||
            (pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0), *pcVar6 != '0'))
           || (pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0), *pcVar6 != 'x')
           ) {
          pcVar6 = (char *)::std::__cxx11::string::c_str();
          uVar5 = strtoul(pcVar6,&stack0xfffffffffffffeb0,10);
          local_154 = (uint)uVar5;
        }
        else {
          pcVar6 = (char *)::std::__cxx11::string::c_str();
          uVar5 = strtoul(pcVar6,&stack0xfffffffffffffeb0,0x10);
          local_154 = (uint)uVar5;
        }
        uVar5 = ::std::__cxx11::string::empty();
        if (((uVar5 & 1) != 0) || ((pcStack_150 != (char *)0x0 && (*pcStack_150 != '\0')))) {
          local_170.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                       ,0x2f);
          local_170.filename = local_170.filename + 1;
          local_170.line = 0xd7;
          local_170.funcname = "ToArrayFromString";
          logger::warn<std::__cxx11::string_const&>
                    (&local_170,"{} bip32 string path fail.",caller_name);
          local_191 = 1;
          pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::operator+(&local_190,caller_name," bip32 string path fail.");
          CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_190);
          local_191 = 0;
          __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if ((local_a1 & 1) != 0) {
          local_154 = local_154 | 0x80000000;
        }
        local_198 = local_154;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (__return_storage_ptr__,&local_198);
        local_108 = 0;
      }
      else {
        if (str.field_2._8_8_ != 0) {
          local_120.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                       ,0x2f);
          local_120.filename = local_120.filename + 1;
          local_120.line = 0xc6;
          local_120.funcname = "ToArrayFromString";
          logger::warn<std::__cxx11::string_const&>
                    (&local_120,"{} bip32 string path fail. empty item.",caller_name);
          p_str_end._7_1_ = 1;
          pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::operator+(&local_140,caller_name," bip32 string path fail. empty item.");
          CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_140);
          p_str_end._7_1_ = 0;
          __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
        }
        local_108 = 4;
      }
    }
    ::std::__cxx11::string::~string((string *)local_a0);
    str.field_2._8_8_ = str.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

static std::vector<uint32_t> ToArrayFromString(
    const std::string& string_path, const std::string& caller_name,
    uint8_t depth) {
  std::vector<uint32_t> result;
  std::vector<std::string> list = StringUtil::Split(string_path, "/");
  for (size_t index = 0; index < list.size(); ++index) {
    std::string str = list[index];
    bool hardened = false;
    if (str.size() <= 1) {
      // do nothing
    } else if (
        (str.back() == '\'') || (str.back() == 'h') || (str.back() == 'H')) {
      str = str.substr(0, str.size() - 1);
      hardened = true;
    }
    if ((str == "m") || (str == "M")) {
      if (depth != 0) {
        warn(
            CFD_LOG_SOURCE, "{} bip32 path fail. this key is not master key.",
            caller_name);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            caller_name + " bip32 path fail. this key is not master key.");
      }
      continue;  // master key
    }
    if (str.empty()) {
      if (index == 0) {
        // start slash pattern
        continue;
      } else {
        warn(
            CFD_LOG_SOURCE, "{} bip32 string path fail. empty item.",
            caller_name);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            caller_name + " bip32 string path fail. empty item.");
      }
    }

    // Conversion by strtol function
    char* p_str_end = nullptr;
    uint32_t value;
    if ((str.size() > 2) && (str[0] == '0') && (str[1] == 'x')) {
      value = std::strtoul(str.c_str(), &p_str_end, 16);
    } else {
      value = std::strtoul(str.c_str(), &p_str_end, 10);
    }
    if (str.empty() || ((p_str_end != nullptr) && (*p_str_end != '\0'))) {
      warn(CFD_LOG_SOURCE, "{} bip32 string path fail.", caller_name);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          caller_name + " bip32 string path fail.");
    }
    if (hardened) value |= 0x80000000;
    result.push_back(static_cast<uint32_t>(value));
  }

  if (result.empty()) {
    warn(CFD_LOG_SOURCE, "{} bip32 string path empty.", caller_name);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        caller_name + " bip32 string path empty.");
  }

  return result;
}